

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.hpp
# Opt level: O2

void __thiscall xs::TestMessage::~TestMessage(TestMessage *this)

{
  ~TestMessage(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~TestMessage	(void) {}